

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

UNewTrie *
utrie_open_63(UNewTrie *fillIn,uint32_t *aliasData,int32_t maxDataLength,uint32_t initialValue,
             uint32_t leadUnitValue,UBool latin1Linear)

{
  uint32_t *puVar1;
  int iVar2;
  int local_40;
  int local_3c;
  int32_t j;
  int32_t i;
  UNewTrie *trie;
  UBool latin1Linear_local;
  uint32_t leadUnitValue_local;
  uint32_t initialValue_local;
  int32_t maxDataLength_local;
  uint32_t *aliasData_local;
  UNewTrie *fillIn_local;
  
  if ((maxDataLength < 0x20) || ((latin1Linear != '\0' && (maxDataLength < 0x400)))) {
    fillIn_local = (UNewTrie *)0x0;
  }
  else {
    _j = fillIn;
    if ((fillIn == (UNewTrie *)0x0) &&
       (_j = (UNewTrie *)uprv_malloc_63(0x44120), _j == (UNewTrie *)0x0)) {
      fillIn_local = (UNewTrie *)0x0;
    }
    else {
      memset(_j,0,0x44120);
      _j->isAllocated = fillIn == (UNewTrie *)0x0;
      if (aliasData == (uint32_t *)0x0) {
        puVar1 = (uint32_t *)uprv_malloc_63((long)(maxDataLength << 2));
        _j->data = puVar1;
        if (_j->data == (uint32_t *)0x0) {
          uprv_free_63(_j);
          return (UNewTrie *)0x0;
        }
        _j->isDataAllocated = '\x01';
      }
      else {
        _j->data = aliasData;
        _j->isDataAllocated = '\0';
      }
      local_40 = 0x20;
      if (latin1Linear != '\0') {
        local_3c = 0;
        do {
          iVar2 = local_3c + 1;
          _j->index[local_3c] = local_40;
          local_40 = local_40 + 0x20;
          local_3c = iVar2;
        } while (iVar2 < 8);
      }
      _j->dataLength = local_40;
      while (0 < local_40) {
        local_40 = local_40 + -1;
        _j->data[local_40] = initialValue;
      }
      _j->leadUnitValue = leadUnitValue;
      _j->indexLength = 0x8800;
      _j->dataCapacity = maxDataLength;
      _j->isLatin1Linear = latin1Linear;
      _j->isCompacted = '\0';
      fillIn_local = _j;
    }
  }
  return fillIn_local;
}

Assistant:

U_CAPI UNewTrie * U_EXPORT2
utrie_open(UNewTrie *fillIn,
           uint32_t *aliasData, int32_t maxDataLength,
           uint32_t initialValue, uint32_t leadUnitValue,
           UBool latin1Linear) {
    UNewTrie *trie;
    int32_t i, j;

    if( maxDataLength<UTRIE_DATA_BLOCK_LENGTH ||
        (latin1Linear && maxDataLength<1024)
    ) {
        return NULL;
    }

    if(fillIn!=NULL) {
        trie=fillIn;
    } else {
        trie=(UNewTrie *)uprv_malloc(sizeof(UNewTrie));
        if(trie==NULL) {
            return NULL;
        }
    }
    uprv_memset(trie, 0, sizeof(UNewTrie));
    trie->isAllocated= (UBool)(fillIn==NULL);

    if(aliasData!=NULL) {
        trie->data=aliasData;
        trie->isDataAllocated=FALSE;
    } else {
        trie->data=(uint32_t *)uprv_malloc(maxDataLength*4);
        if(trie->data==NULL) {
            uprv_free(trie);
            return NULL;
        }
        trie->isDataAllocated=TRUE;
    }

    /* preallocate and reset the first data block (block index 0) */
    j=UTRIE_DATA_BLOCK_LENGTH;

    if(latin1Linear) {
        /* preallocate and reset the first block (number 0) and Latin-1 (U+0000..U+00ff) after that */
        /* made sure above that maxDataLength>=1024 */

        /* set indexes to point to consecutive data blocks */
        i=0;
        do {
            /* do this at least for trie->index[0] even if that block is only partly used for Latin-1 */
            trie->index[i++]=j;
            j+=UTRIE_DATA_BLOCK_LENGTH;
        } while(i<(256>>UTRIE_SHIFT));
    }

    /* reset the initially allocated blocks to the initial value */
    trie->dataLength=j;
    while(j>0) {
        trie->data[--j]=initialValue;
    }

    trie->leadUnitValue=leadUnitValue;
    trie->indexLength=UTRIE_MAX_INDEX_LENGTH;
    trie->dataCapacity=maxDataLength;
    trie->isLatin1Linear=latin1Linear;
    trie->isCompacted=FALSE;
    return trie;
}